

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O0

bool test_type_conversion<unsigned_char>(Boxed_Value *bv,bool expectedpass)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  Type_Info *this;
  char *pcVar4;
  bool ret;
  bool expectedpass_local;
  Boxed_Value *bv_local;
  
  bVar1 = run_test_type_conversion<unsigned_char>(bv,expectedpass);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error with type conversion test. From: ");
    bVar2 = chaiscript::Boxed_Value::is_const(bv);
    pcVar4 = "";
    if (bVar2) {
      pcVar4 = "const ";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    this = chaiscript::Boxed_Value::get_type_info(bv);
    pcVar4 = chaiscript::Type_Info::name(this);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," To: ");
    poVar3 = std::operator<<(poVar3,"");
    pcVar4 = std::type_info::name((type_info *)&unsigned_char::typeinfo);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," test was expected to ");
    pcVar4 = "fail";
    if (expectedpass) {
      pcVar4 = "succeed";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3," but did not\n");
  }
  return bVar1;
}

Assistant:

bool test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  bool ret = run_test_type_conversion<To>(bv, expectedpass);

  if (!ret) {
    std::cerr << "Error with type conversion test. From: " << (bv.is_const() ? "const " : "")
              << bv.get_type_info().name() << " To: " << (std::is_const<To>::value ? "const " : "")
              << typeid(To).name() << " test was expected to " << (expectedpass ? "succeed" : "fail")
              << " but did not\n";
  }

  return ret;
}